

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O1

Abc_Cex_t * Saig_ManExtendCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  byte bVar2;
  void *pvVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Abc_Cex_t *pAVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  Vec_Ptr_t *pVVar13;
  uint uVar14;
  
  uVar6 = 0;
  pAVar8 = Abc_CexAlloc(0,pAig->nObjs[2],p->iFrame + 1);
  pAVar8->iPo = p->iPo;
  pAVar8->iFrame = p->iFrame;
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  if (0 < pAig->nRegs) {
    uVar10 = 0;
    do {
      uVar6 = pAig->nTruePis + (int)uVar10;
      if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_006d850e;
      pvVar3 = pAig->vCis->pArray[uVar6];
      uVar6 = (int)uVar10 + 1;
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[uVar10 >> 5] >> ((byte)uVar10 & 0x1f) & 1) << 5);
      uVar10 = (ulong)uVar6;
    } while ((int)uVar6 < pAig->nRegs);
  }
  if (-1 < p->iFrame) {
    iVar7 = 0;
    while( true ) {
      if (0 < pAig->nTruePis) {
        lVar12 = 0;
        do {
          if (pAig->vCis->nSize <= lVar12) goto LAB_006d850e;
          pvVar3 = pAig->vCis->pArray[lVar12];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&p[1].iPo)[(int)((ulong)uVar6 + lVar12) >> 5] >>
                        ((byte)((ulong)uVar6 + lVar12) & 0x1f) & 1) << 5);
          lVar12 = lVar12 + 1;
        } while (lVar12 < pAig->nTruePis);
        uVar6 = uVar6 + (int)lVar12;
      }
      pVVar13 = pAig->vCis;
      if (0 < pVVar13->nSize) {
        ppvVar4 = pVVar13->pArray;
        lVar12 = 0;
        do {
          if ((*(byte *)((long)ppvVar4[lVar12] + 0x18) & 0x20) != 0) {
            iVar9 = pAig->nObjs[2] * iVar7 + (int)lVar12;
            (&pAVar8[1].iPo)[iVar9 >> 5] = (&pAVar8[1].iPo)[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar13->nSize);
      }
      pVVar13 = pAig->vObjs;
      if (0 < pVVar13->nSize) {
        lVar12 = 0;
        do {
          pvVar3 = pVVar13->pArray[lVar12];
          if (pvVar3 != (void *)0x0) {
            if (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7) {
              *(ulong *)((long)pvVar3 + 0x18) =
                   *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
                   (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                            *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18)
                            >> 5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                                    *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) +
                                             0x18) >> 5) & 1) << 5);
            }
          }
          lVar12 = lVar12 + 1;
          pVVar13 = pAig->vObjs;
        } while (lVar12 < pVVar13->nSize);
      }
      pVVar13 = pAig->vCos;
      if (0 < pVVar13->nSize) {
        lVar12 = 0;
        do {
          pvVar3 = pVVar13->pArray[lVar12];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar12 = lVar12 + 1;
          pVVar13 = pAig->vCos;
        } while (lVar12 < pVVar13->nSize);
      }
      if (iVar7 == p->iFrame) break;
      if (0 < pAig->nRegs) {
        iVar9 = 0;
        do {
          uVar11 = pAig->nTruePos + iVar9;
          if (((((int)uVar11 < 0) || (pAig->vCos->nSize <= (int)uVar11)) ||
              (uVar14 = pAig->nTruePis + iVar9, (int)uVar14 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar14)) goto LAB_006d850e;
          pvVar3 = pAig->vCis->pArray[uVar14];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar11] + 0x18) & 0x20);
          iVar9 = iVar9 + 1;
        } while (iVar9 < pAig->nRegs);
      }
      bVar5 = p->iFrame <= iVar7;
      iVar7 = iVar7 + 1;
      if (bVar5) break;
    }
  }
  if (uVar6 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                  ,0x1a1,"Abc_Cex_t *Saig_ManExtendCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar7 = p->iPo;
  if ((-1 < (long)iVar7) && (iVar7 < pAig->vCos->nSize)) {
    bVar2 = *(byte *)((long)pAig->vCos->pArray[iVar7] + 0x18);
    Aig_ManCleanMarkB(pAig);
    if ((bVar2 & 0x20) == 0) {
      puts("Saig_ManExtendCex(): The counter-example is invalid!!!");
    }
    return pAVar8;
  }
LAB_006d850e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Cex_t * Saig_ManExtendCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Abc_Cex_t * pNew;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    // create new counter-example
    pNew = Abc_CexAlloc( 0, Aig_ManCiNum(pAig), p->iFrame + 1 );
    pNew->iPo = p->iPo;
    pNew->iFrame = p->iFrame;
    // simulate the AIG
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        ///////// write PI+LO values ////////////
        Aig_ManForEachCi( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit(pNew->pData, Aig_ManCiNum(pAig)*i + k);
        /////////////////////////////////////////
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    if ( RetValue == 0 )
        printf( "Saig_ManExtendCex(): The counter-example is invalid!!!\n" );
    return pNew;
}